

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFindInvalidData.cpp
# Opt level: O0

void __thiscall
utFindInvalidDataProcess_testStepPositiveResult_Test::TestBody
          (utFindInvalidDataProcess_testStepPositiveResult_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f0;
  Message local_e8;
  void *local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  uint i;
  Message local_b8;
  void *local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  void *local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  void *local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  void *local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  utFindInvalidDataProcess_testStepPositiveResult_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  Assimp::FindInvalidDataProcess::ProcessMesh
            ((this->super_utFindInvalidDataProcess).mProcess,
             (this->super_utFindInvalidDataProcess).mMesh);
  local_28 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiVector3t<float>*>
            ((internal *)local_20,"nullptr","mMesh->mVertices",&local_28,
             &((this->super_utFindInvalidDataProcess).mMesh)->mVertices);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_60 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiVector3t<float>*>
            ((internal *)local_58,"nullptr","mMesh->mNormals",&local_60,
             &((this->super_utFindInvalidDataProcess).mMesh)->mNormals);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_88 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiVector3t<float>*>
            ((internal *)local_80,"nullptr","mMesh->mTangents",&local_88,
             &((this->super_utFindInvalidDataProcess).mMesh)->mTangents);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b0 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiVector3t<float>*>
            ((internal *)local_a8,"nullptr","mMesh->mBitangents",&local_b0,
             &((this->super_utFindInvalidDataProcess).mMesh)->mBitangents);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff40,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff40);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  for (gtest_ar_4.message_.ptr_._4_4_ = 0; gtest_ar_4.message_.ptr_._4_4_ < 8;
      gtest_ar_4.message_.ptr_._4_4_ = gtest_ar_4.message_.ptr_._4_4_ + 1) {
    local_e0 = (void *)0x0;
    testing::internal::CmpHelperNE<decltype(nullptr),aiVector3t<float>*>
              ((internal *)local_d8,"nullptr","mMesh->mTextureCoords[i]",&local_e0,
               ((this->super_utFindInvalidDataProcess).mMesh)->mTextureCoords +
               gtest_ar_4.message_.ptr_._4_4_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFindInvalidData.cpp"
                 ,0x8f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  }
  return;
}

Assistant:

TEST_F(utFindInvalidDataProcess, testStepPositiveResult) {
    mProcess->ProcessMesh(mMesh);

    EXPECT_NE(nullptr, mMesh->mVertices);

    EXPECT_NE(nullptr, mMesh->mNormals);
    EXPECT_NE(nullptr, mMesh->mTangents);
    EXPECT_NE(nullptr, mMesh->mBitangents);

    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        EXPECT_NE(nullptr, mMesh->mTextureCoords[i]);
    }
}